

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O1

void __thiscall
wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::pushChoice
          (TopologicalOrdersImpl<std::less<unsigned_int>_> *this,Index choice)

{
  uint uVar1;
  iterator __position;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  uint local_14 [2];
  Index choice_local;
  
  __position._M_current =
       (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->choiceHeap,__position,
               local_14);
  }
  else {
    *__position._M_current = choice;
    (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  puVar2 = (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar1 = puVar3[-1];
  lVar6 = (long)puVar3 - (long)puVar2 >> 2;
  lVar5 = lVar6 + -1;
  if (1 < lVar6) {
    do {
      lVar6 = (lVar5 - (lVar5 + -1 >> 0x3f)) + -1 >> 1;
      if (puVar2[lVar6] <= uVar1) break;
      puVar2[lVar5] = puVar2[lVar6];
      bVar4 = 2 < lVar5;
      lVar5 = lVar6;
    } while (bVar4);
  }
  puVar2[lVar5] = uVar1;
  return;
}

Assistant:

void pushChoice(Index choice) {
    choiceHeap.push_back(choice);
    std::push_heap(choiceHeap.begin(), choiceHeap.end(), [&](Index a, Index b) {
      return cmp(b, a);
    });
  }